

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O2

void __thiscall CaseType::GenPrivDecls(CaseType *this,Output *out_h,Env *env)

{
  ExternType *pEVar1;
  char *pcVar2;
  undefined8 local_40 [4];
  
  pEVar1 = (ExternType *)Expr::DataType(this->index_expr_,env);
  if ((pEVar1->super_Type).tot_ != BUILTIN) {
    pEVar1 = extern_type_int;
  }
  (*(pEVar1->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_40,pEVar1);
  pcVar2 = Env::LValue(env,this->index_var_);
  Output::println(out_h,"%s %s;",local_40[0],pcVar2);
  std::__cxx11::string::~string((string *)local_40);
  Type::GenPrivDecls(&this->super_Type,out_h,env);
  return;
}

Assistant:

void CaseType::GenPrivDecls(Output* out_h, Env* env)
	{
	Type* t = index_expr_->DataType(env);

	if ( t->tot() != Type::BUILTIN )
		// It's a Type::EXTERN with a C++ type of "int", "bool", or "enum",
		// any of which will convert consistently using an int as storage type.
		t = extern_type_int;

	out_h->println("%s %s;", t->DataTypeStr().c_str(), env->LValue(index_var_));
	Type::GenPrivDecls(out_h, env);
	}